

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.h
# Opt level: O1

void __thiscall
cmExportLibraryDependenciesCommand::~cmExportLibraryDependenciesCommand
          (cmExportLibraryDependenciesCommand *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_cmCommand)._vptr_cmCommand =
       (_func_int **)&PTR__cmExportLibraryDependenciesCommand_006f2e18;
  pcVar1 = (this->Filename)._M_dataplus._M_p;
  paVar2 = &(this->Filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_006f2350;
  pcVar1 = (this->super_cmCommand).Error._M_dataplus._M_p;
  paVar2 = &(this->super_cmCommand).Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    return new cmExportLibraryDependenciesCommand;
  }